

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int iVar6;
  shared_ptr<VideoHandler> videoHandler;
  opt_t opt;
  undefined1 local_101;
  ImageHandler *local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  opt_t local_f0;
  
  local_f0.filePath._M_dataplus._M_p = (pointer)&local_f0.filePath.field_2;
  local_f0.filePath._M_string_length = 0;
  local_f0.filePath.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_f0.video.field_2;
  local_f0.video._M_string_length = 0;
  local_f0.video.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_f0.detector.field_2;
  local_f0.detector._M_string_length = 0;
  local_f0.detector.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_f0.effect.field_2;
  local_f0.effect._M_string_length = 0;
  local_f0.effect.field_2._M_local_buf[0] = '\0';
  paVar4 = &local_f0.image.field_2;
  local_f0.image._M_string_length = 0;
  local_f0.image.field_2._M_local_buf[0] = '\0';
  paVar5 = &local_f0.target.field_2;
  local_f0.target._M_string_length = 0;
  local_f0.target.field_2._M_local_buf[0] = '\0';
  local_f0.video._M_dataplus._M_p = (pointer)paVar1;
  local_f0.detector._M_dataplus._M_p = (pointer)paVar2;
  local_f0.effect._M_dataplus._M_p = (pointer)paVar3;
  local_f0.image._M_dataplus._M_p = (pointer)paVar4;
  local_f0.target._M_dataplus._M_p = (pointer)paVar5;
  processCommandLine(argc,argv,&local_f0);
  if ((local_f0.video._M_string_length == 0) || (iVar6 = -1, local_f0.image._M_string_length == 0))
  {
    if (local_f0.video._M_string_length == 0) {
      iVar6 = 0;
      if (local_f0.image._M_string_length != 0) {
        local_100 = (ImageHandler *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<ImageHandler,std::allocator<ImageHandler>,std::__cxx11::string&,std::__cxx11::string&>
                  (&local_f8,&local_100,(allocator<ImageHandler> *)&local_101,&local_f0.detector,
                   &local_f0.effect);
        (**(local_100->super_MediaHandler)._vptr_MediaHandler)(local_100,&local_f0,&local_f0.target)
        ;
        (*(local_100->super_MediaHandler)._vptr_MediaHandler[1])();
        (*(local_100->super_MediaHandler)._vptr_MediaHandler[2])(local_100,&local_f0.image);
        if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
        }
      }
    }
    else {
      local_100 = (ImageHandler *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<VideoHandler,std::allocator<VideoHandler>,std::__cxx11::string&,std::__cxx11::string&>
                (&local_f8,(VideoHandler **)&local_100,(allocator<VideoHandler> *)&local_101,
                 &local_f0.detector,&local_f0.effect);
      (**(local_100->super_MediaHandler)._vptr_MediaHandler)(local_100,&local_f0,&local_f0.target);
      (*(local_100->super_MediaHandler)._vptr_MediaHandler[1])();
      (*(local_100->super_MediaHandler)._vptr_MediaHandler[2])(local_100,&local_f0.video);
      if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
      }
      iVar6 = 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.target._M_dataplus._M_p != paVar5) {
    operator_delete(local_f0.target._M_dataplus._M_p,
                    CONCAT71(local_f0.target.field_2._M_allocated_capacity._1_7_,
                             local_f0.target.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.image._M_dataplus._M_p != paVar4) {
    operator_delete(local_f0.image._M_dataplus._M_p,
                    CONCAT71(local_f0.image.field_2._M_allocated_capacity._1_7_,
                             local_f0.image.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.effect._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0.effect._M_dataplus._M_p,
                    CONCAT71(local_f0.effect.field_2._M_allocated_capacity._1_7_,
                             local_f0.effect.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.detector._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0.detector._M_dataplus._M_p,
                    CONCAT71(local_f0.detector.field_2._M_allocated_capacity._1_7_,
                             local_f0.detector.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.video._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.video._M_dataplus._M_p,
                    CONCAT71(local_f0.video.field_2._M_allocated_capacity._1_7_,
                             local_f0.video.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.filePath._M_dataplus._M_p != &local_f0.filePath.field_2) {
    operator_delete(local_f0.filePath._M_dataplus._M_p,
                    CONCAT71(local_f0.filePath.field_2._M_allocated_capacity._1_7_,
                             local_f0.filePath.field_2._M_local_buf[0]) + 1);
  }
  return iVar6;
}

Assistant:

int main(int argc, char** argv)
{
    opt_t opt;

    processCommandLine(argc, argv, opt);

    if (!opt.video.empty() && !opt.image.empty()) 
    {
        return -1;
    }
    
    if (!opt.video.empty()) 
    {
        auto videoHandler = std::make_shared<VideoHandler>(opt.detector, opt.effect);
        videoHandler->preProcess(opt.filePath, opt.target);
        videoHandler->doTask();
        videoHandler->postProcess(opt.video);
    } 
    else if (!opt.image.empty()) 
    {
        auto imgHandler = std::make_shared<ImageHandler>(opt.detector, opt.effect);
        imgHandler->preProcess(opt.filePath, opt.target);
        imgHandler->doTask();
        imgHandler->postProcess(opt.image);
    }

    return 0;
}